

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O3

int hts_close(htsFile *fp)

{
  htsExactFormat hVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  BGZF *fp_00;
  
  hVar1 = (fp->format).format;
  iVar3 = -1;
  if (bcf < hVar1) goto LAB_0010bada;
  if ((0x10cU >> (hVar1 & 0x1f) & 1) == 0) {
    if ((0x212U >> (hVar1 & 0x1f) & 1) == 0) {
      if (hVar1 == cram) {
        if ((undefined1  [96])((undefined1  [96])*fp & (undefined1  [96])0x2) ==
            (undefined1  [96])0x0) {
          iVar3 = cram_eof((fp->fp).cram);
          if (iVar3 == 2) {
            hts_close_cold_1();
          }
          else if (iVar3 == 0) {
            hts_close_cold_2();
            return -1;
          }
        }
        iVar3 = cram_close((fp->fp).cram);
      }
      goto LAB_0010bada;
    }
    fp_00 = (fp->fp).bgzf;
  }
  else {
    if ((undefined1  [96])((undefined1  [96])*fp & (undefined1  [96])0x2) == (undefined1  [96])0x0)
    {
      iVar3 = bgzf_close((BGZF *)((fp->fp).cram)->header);
      ks_destroy((kstream_t *)(fp->fp).bgzf);
      goto LAB_0010bada;
    }
    fp_00 = (fp->fp).bgzf;
    if ((fp->format).compression == no_compression) {
      iVar3 = hclose((hFILE *)fp_00);
      goto LAB_0010bada;
    }
  }
  iVar3 = bgzf_close(fp_00);
LAB_0010bada:
  piVar4 = __errno_location();
  iVar2 = *piVar4;
  free(fp->fn);
  free(fp->fn_aux);
  free((fp->line).s);
  free(fp);
  *piVar4 = iVar2;
  return iVar3;
}

Assistant:

int hts_close(htsFile *fp)
{
    int ret, save;

    switch (fp->format.format) {
    case binary_format:
    case bam:
    case bcf:
        ret = bgzf_close(fp->fp.bgzf);
        break;

    case cram:
        if (!fp->is_write) {
            switch (cram_eof(fp->fp.cram)) {
            case 0:
                fprintf(stderr, "[E::%s] Failed to decode sequence.\n", __func__);
                return -1;
            case 2:
                fprintf(stderr, "[W::%s] EOF marker is absent. The input is probably truncated.\n", __func__);
                break;
            default: /* case 1, expected EOF */
                break;
            }
        }
        ret = cram_close(fp->fp.cram);
        break;

    case text_format:
    case sam:
    case vcf:
        if (!fp->is_write) {
        #if KS_BGZF
            BGZF *gzfp = ((kstream_t*)fp->fp.voidp)->f;
            ret = bgzf_close(gzfp);
        #else
            gzFile gzfp = ((kstream_t*)fp->fp.voidp)->f;
            ret = gzclose(gzfp);
        #endif
            ks_destroy((kstream_t*)fp->fp.voidp);
        }
        else if (fp->format.compression != no_compression)
            ret = bgzf_close(fp->fp.bgzf);
        else
            ret = hclose(fp->fp.hfile);
        break;

    default:
        ret = -1;
        break;
    }

    save = errno;
    free(fp->fn);
    free(fp->fn_aux);
    free(fp->line.s);
    free(fp);
    errno = save;
    return ret;
}